

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O2

TokenStream * __thiscall
glslang::TPpContext::PrescanMacroArg
          (TPpContext *this,TokenStream *arg,TPpToken *ppToken,bool newLineOkay)

{
  uint token;
  MacroExpandResult MVar1;
  TokenStream *this_00;
  tInput *in;
  
  this_00 = (TokenStream *)::operator_new(0x28);
  TokenStream::TokenStream(this_00);
  in = (tInput *)::operator_new(0x18);
  in->done = false;
  in->pp = this;
  in->_vptr_tInput = (_func_int **)&PTR__tInput_008a4088;
  pushInput(this,in);
  pushTokenStreamInput(this,arg,false,false);
LAB_003bdbf6:
  token = scanToken(this,ppToken);
  if ((~token & 0xfffffffd) != 0) {
    token = tokenPaste(this,token,ppToken);
    if (token == 0xa2) goto code_r0x003bdc22;
    if ((~token & 0xfffffffd) != 0) goto LAB_003bdc4c;
  }
  goto LAB_003bdc71;
code_r0x003bdc22:
  MVar1 = MacroExpand(this,ppToken,false,newLineOkay);
  if (1 < MVar1 - MacroExpandStarted) {
    if (MVar1 == MacroExpandError) goto LAB_003bdc5b;
LAB_003bdc4c:
    TokenStream::putToken(this_00,token,ppToken);
  }
  goto LAB_003bdbf6;
LAB_003bdc5b:
  do {
    token = scanToken(this,ppToken);
  } while ((~token & 0xfffffffd) != 0);
LAB_003bdc71:
  if (token != 0xfffffffd) {
    operator_delete(this_00,0x28);
    this_00 = (TokenStream *)0x0;
  }
  return this_00;
}

Assistant:

TPpContext::TokenStream* TPpContext::PrescanMacroArg(TokenStream& arg, TPpToken* ppToken, bool newLineOkay)
{
    // expand the argument
    TokenStream* expandedArg = new TokenStream;
    pushInput(new tMarkerInput(this));
    pushTokenStreamInput(arg);
    int token;
    while ((token = scanToken(ppToken)) != tMarkerInput::marker && token != EndOfInput) {
        token = tokenPaste(token, *ppToken);
        if (token == PpAtomIdentifier) {
            switch (MacroExpand(ppToken, false, newLineOkay)) {
            case MacroExpandNotStarted:
                break;
            case MacroExpandError:
                // toss the rest of the pushed-input argument by scanning until tMarkerInput
                while ((token = scanToken(ppToken)) != tMarkerInput::marker && token != EndOfInput)
                    ;
                break;
            case MacroExpandStarted:
            case MacroExpandUndef:
                continue;
            }
        }
        if (token == tMarkerInput::marker || token == EndOfInput)
            break;
        expandedArg->putToken(token, ppToken);
    }

    if (token != tMarkerInput::marker) {
        // Error, or MacroExpand ate the marker, so had bad input, recover
        delete expandedArg;
        expandedArg = nullptr;
    }

    return expandedArg;
}